

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::LE_Detonation_PDU::LE_Detonation_PDU(LE_Detonation_PDU *this,LE_EntityIdentifier *ID)

{
  KUINT8 KVar1;
  KUINT16 KVar2;
  
  LE_Header::LE_Header(&this->super_LE_Header);
  (this->super_LE_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__LE_Detonation_PDU_002143e0;
  DATA_TYPE::LE_EntityIdentifier::LE_EntityIdentifier(&this->m_TargetID);
  DATA_TYPE::LE_EntityIdentifier::LE_EntityIdentifier(&this->m_MunitionID);
  DATA_TYPE::LE_EntityIdentifier::LE_EntityIdentifier(&this->m_EventID);
  DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>_>::LE_Vector
            (&this->m_LocEntCoord);
  DATA_TYPE::RelativeWorldCoordinates::RelativeWorldCoordinates(&this->m_LocWrldCoord);
  DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>_>::LE_Vector
            (&this->m_Vel);
  DATA_TYPE::LE_EulerAngles::LE_EulerAngles(&this->m_Ori);
  DATA_TYPE::MunitionDescriptor::MunitionDescriptor(&this->m_MunitionDesc);
  this->m_ui8DetonationResult = '\0';
  KVar1 = ID->m_ui8ApplicationID;
  KVar2 = ID->m_ui16EntityID;
  (this->super_LE_Header).m_EntID.m_ui8SiteID = ID->m_ui8SiteID;
  (this->super_LE_Header).m_EntID.m_ui8ApplicationID = KVar1;
  (this->super_LE_Header).m_EntID.m_ui16EntityID = KVar2;
  this->m_DetonationFlag1Union = (anon_union_1_2_647d7bf6_for_m_DetonationFlag1Union)0x0;
  this->m_DetonationFlag2Union = (anon_union_1_2_647d7bf6_for_m_DetonationFlag2Union)0x0;
  (this->super_LE_Header).super_Header.super_Header6.m_ui8PDUType = '2';
  (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  return;
}

Assistant:

LE_Detonation_PDU::LE_Detonation_PDU( const LE_EntityIdentifier & ID ) :
    m_ui8DetonationResult( 0 )
{
    m_EntID = ID;
    m_DetonationFlag1Union.m_ui8Flag = 0;
    m_DetonationFlag2Union.m_ui8Flag = 0;
    m_ui8PDUType = LEDetonation_PDU_Type;
    m_ui16PDULength = LE_DETONATION_PDU_SIZE;
}